

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
::
findImpl<axl::sl::BoyerMooreIncrementalAccessorBase<char,false,axl::sl::BoyerMooreStateBase<char>>>
          (BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
           *this,BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>
                 *accessor,size_t i0,size_t length)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  BoyerMooreStateBase<char> *pBVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t tailLength;
  long lVar11;
  size_t local_60;
  
  lVar4 = *(long *)(this + 0x10);
  uVar8 = lVar4 + -1 + i0;
  pBVar5 = accessor->m_state;
  do {
    if (length <= uVar8) {
      return uVar8 - (lVar4 + -1);
    }
    uVar10 = (pBVar5->m_tail).m_length;
    sVar9 = (uVar8 - lVar4) + 1;
    lVar11 = 0;
    while( true ) {
      uVar1 = lVar11 + uVar8;
      if (uVar1 < uVar10) {
        pcVar7 = (pBVar5->m_tail).m_buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p +
                 ((pBVar5->m_tail).m_front + uVar1) %
                 (pBVar5->m_tail).m_buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.
                 m_count;
      }
      else {
        pcVar7 = accessor->m_p + lVar11 + (uVar8 - uVar10);
      }
      cVar2 = *pcVar7;
      cVar3 = *(char *)(*(long *)this + lVar4 + -1 + lVar11);
      if (cVar2 != cVar3) break;
      sVar6 = sVar9;
      if (1 - lVar4 == lVar11) goto LAB_00122527;
      lVar11 = lVar11 + -1;
    }
    uVar8 = *(ulong *)(*(long *)(this + 0x18) + ((ulong)(long)cVar2 % *(ulong *)(this + 0x28)) * 8);
    uVar10 = *(ulong *)(*(long *)(this + 0x30) + -8 + lVar4 * 8 + lVar11 * 8);
    if (uVar10 < uVar8) {
      uVar10 = uVar8;
    }
    sVar9 = uVar10 + uVar1;
    sVar6 = local_60;
LAB_00122527:
    local_60 = sVar6;
    uVar8 = sVar9;
    if (cVar2 == cVar3) {
      return local_60;
    }
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}